

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Print.cpp
# Opt level: O0

void __thiscall
wasm::PrintExpressionContents::visitSIMDLoadStoreLane
          (PrintExpressionContents *this,SIMDLoadStoreLane *curr)

{
  Index IVar1;
  address64_t aVar2;
  ostream *poVar3;
  Module *in_R8;
  Name name;
  SIMDLoadStoreLane *curr_local;
  PrintExpressionContents *this_local;
  
  prepareColor(this->o);
  switch(curr->op) {
  case Load8LaneVec128:
    std::operator<<(this->o,"v128.load8_lane");
    break;
  case Load16LaneVec128:
    std::operator<<(this->o,"v128.load16_lane");
    break;
  case Load32LaneVec128:
    std::operator<<(this->o,"v128.load32_lane");
    break;
  case Load64LaneVec128:
    std::operator<<(this->o,"v128.load64_lane");
    break;
  case Store8LaneVec128:
    std::operator<<(this->o,"v128.store8_lane");
    break;
  case Store16LaneVec128:
    std::operator<<(this->o,"v128.store16_lane");
    break;
  case Store32LaneVec128:
    std::operator<<(this->o,"v128.store32_lane");
    break;
  case Store64LaneVec128:
    std::operator<<(this->o,"v128.store64_lane");
  }
  restoreNormalColor(this->o);
  name.super_IString.str._M_str = (char *)this->o;
  name.super_IString.str._M_len = (size_t)(curr->memory).super_IString.str._M_str;
  anon_unknown_0::printMemoryName
            ((anon_unknown_0 *)(curr->memory).super_IString.str._M_len,name,(ostream *)this->wasm,
             in_R8);
  aVar2 = wasm::Address::operator_cast_to_unsigned_long(&curr->offset);
  if (aVar2 != 0) {
    poVar3 = std::operator<<(this->o," offset=");
    aVar2 = wasm::Address::operator_cast_to_unsigned_long(&curr->offset);
    std::ostream::operator<<(poVar3,aVar2);
  }
  aVar2 = wasm::Address::operator_cast_to_unsigned_long(&curr->align);
  IVar1 = SIMDLoadStoreLane::getMemBytes(curr);
  if (aVar2 != IVar1) {
    poVar3 = std::operator<<(this->o," align=");
    aVar2 = wasm::Address::operator_cast_to_unsigned_long(&curr->align);
    std::ostream::operator<<(poVar3,aVar2);
  }
  poVar3 = std::operator<<(this->o," ");
  std::ostream::operator<<(poVar3,(uint)curr->index);
  return;
}

Assistant:

void visitSIMDLoadStoreLane(SIMDLoadStoreLane* curr) {
    prepareColor(o);
    switch (curr->op) {
      case Load8LaneVec128:
        o << "v128.load8_lane";
        break;
      case Load16LaneVec128:
        o << "v128.load16_lane";
        break;
      case Load32LaneVec128:
        o << "v128.load32_lane";
        break;
      case Load64LaneVec128:
        o << "v128.load64_lane";
        break;
      case Store8LaneVec128:
        o << "v128.store8_lane";
        break;
      case Store16LaneVec128:
        o << "v128.store16_lane";
        break;
      case Store32LaneVec128:
        o << "v128.store32_lane";
        break;
      case Store64LaneVec128:
        o << "v128.store64_lane";
        break;
    }
    restoreNormalColor(o);
    printMemoryName(curr->memory, o, wasm);
    if (curr->offset) {
      o << " offset=" << curr->offset;
    }
    if (curr->align != curr->getMemBytes()) {
      o << " align=" << curr->align;
    }
    o << " " << int(curr->index);
  }